

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseNodesSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  char *szCurrent_00;
  int iVar1;
  byte *pbVar2;
  char *local_38;
  
  local_38 = szCurrent;
  if (szCurrent != (char *)0x0) {
    do {
      szCurrent_00 = local_38;
      iVar1 = strncasecmp(local_38,"end",3);
      if (((iVar1 == 0) && ((ulong)(byte)szCurrent_00[3] < 0x21)) &&
         ((0x100003601U >> ((ulong)(byte)szCurrent_00[3] & 0x3f) & 1) != 0)) {
        pbVar2 = (byte *)(szCurrent_00 + 4);
        this->iLineNumber = this->iLineNumber + 1;
        while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
          pbVar2 = pbVar2 + 1;
        }
        *szCurrentOut = (char *)pbVar2;
        return;
      }
      ParseNodeInfo(this,szCurrent_00,&local_38);
    } while (local_38 != (char *)0x0);
  }
  __assert_fail("__null != s1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                ,0xbf,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
}

Assistant:

void SMDImporter::ParseNodesSection(const char* szCurrent, const char** szCurrentOut) {
    for ( ;; ) {
        // "end\n" - Ends the nodes section
        if (0 == ASSIMP_strincmp(szCurrent,"end",3) && IsSpaceOrNewLine(*(szCurrent+3))) {
            szCurrent += 4;
            break;
        }
        ParseNodeInfo(szCurrent,&szCurrent);
    }
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}